

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
DoCopyMembers<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs,CrtAllocator *allocator,bool copyConstStrings)

{
  uint uVar1;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar2;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  ulong n;
  bool bVar3;
  
  if (((rhs->data_).f.flags & 7) == 3) {
    *(undefined2 *)(this + 0xe) = 3;
    uVar1 = (rhs->data_).s.length;
    n = (ulong)uVar1;
    pGVar2 = Malloc<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       (allocator,n);
    rhs_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)((ulong)(rhs->data_).s.str & 0xffffffffffff);
    this_00 = pGVar2;
    while (bVar3 = n != 0, n = n - 1, bVar3) {
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)this_00,rhs_00,
                 allocator,copyConstStrings);
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)&this_00->value,
                 rhs_00 + 1,allocator,copyConstStrings);
      this_00 = this_00 + 1;
      rhs_00 = rhs_00 + 2;
    }
    *(uint *)(this + 4) = uVar1;
    *(uint *)this = uVar1;
    *(ulong *)(this + 8) = (ulong)*(ushort *)(this + 0xe) << 0x30 | (ulong)pGVar2;
    return;
  }
  __assert_fail("rhs.GetType() == kObjectType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x94c,
                "void rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::DoCopyMembers(const GenericValue<Encoding, SourceAllocator> &, Allocator &, bool) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

Type GetType()  const { return static_cast<Type>(data_.f.flags & kTypeMask); }